

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O1

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::setValue(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,Matrix<double,__1,_1,_0,__1,_1> *v,TimeIndex k)

{
  double *pdVar1;
  double *pdVar2;
  _Map_pointer ppMVar3;
  _Map_pointer ppMVar4;
  _Elt_pointer pMVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double dVar9;
  Index size;
  long lVar10;
  ulong uVar11;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  ulong uVar12;
  
  ppMVar3 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppMVar4 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pMVar5 = (this->v_).
           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  lVar10 = ((long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar5 >> 4) +
           ((long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(this->v_).
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)ppMVar3 - (long)ppMVar4) >> 3) - 1) +
           (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x20;
  if (lVar10 != 0) {
    if ((this->k_ <= k) && (k < this->k_ + lVar10)) {
      if (lVar10 != 0) {
        lVar6 = this->k_;
        if ((lVar6 <= k) && (k < lVar6 + lVar10)) {
          uVar11 = ((long)pMVar5 -
                    (long)(this->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + (k - lVar6);
          if (uVar11 < 0x20) {
            this_00 = (DenseStorage<double,__1,__1,_1,_0> *)(pMVar5 + (k - lVar6));
          }
          else {
            uVar12 = uVar11 >> 5 | 0xf800000000000000;
            if (0 < (long)uVar11) {
              uVar12 = uVar11 >> 5;
            }
            this_00 = (DenseStorage<double,__1,__1,_1,_0> *)
                      (ppMVar4[uVar12] + uVar11 + uVar12 * -0x20);
          }
          pdVar7 = (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          uVar11 = (v->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows;
          if (this_00->m_rows != uVar11) {
            if ((long)uVar11 < 0) {
              __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                            "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(this_00,uVar11,uVar11,1);
          }
          uVar12 = this_00->m_rows;
          if (uVar12 == uVar11) {
            pdVar8 = this_00->m_data;
            uVar11 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar12) {
              lVar10 = 0;
              do {
                pdVar1 = pdVar7 + lVar10;
                dVar9 = pdVar1[1];
                pdVar2 = pdVar8 + lVar10;
                *pdVar2 = *pdVar1;
                pdVar2[1] = dVar9;
                lVar10 = lVar10 + 2;
              } while (lVar10 < (long)uVar11);
            }
            if ((long)uVar11 < (long)uVar12) {
              do {
                pdVar8[uVar11] = pdVar7[uVar11];
                uVar11 = uVar11 + 1;
              } while (uVar12 != uVar11);
            }
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                       );
        }
      }
      __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x192,
                    "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                   );
    }
    if ((lVar10 != 0) && (lVar10 + this->k_ != k)) {
      __assert_fail("(v_.size()==0 || k_+ TimeIndex(v_.size()) == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x1a2,
                    "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::checkNext_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                   );
    }
  }
  ppMVar3 = (this->v_).
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->v_).
             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)ppMVar3 -
                (long)(this->v_).
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppMVar3 == (_Map_pointer)0x0)) * 0x20 == 0) {
    this->k_ = k;
  }
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::push_back(&this->v_,v);
  return;
}

Assistant:

inline TimeIndex IndexedMatrixArrayT<MatrixType, Allocator>::setLastIndex(int index)
{
  return k_=index-(v_.size()+1);
}